

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieNew.c
# Opt level: O2

int Au_NtkNodeNumFunc(Au_Ntk_t *p,int Func)

{
  Au_Obj_t *pAVar1;
  int iVar2;
  int i;
  
  if ((p->pMan == (Au_Man_t *)0x0) || (iVar2 = 0, p->pMan->pFuncs == (Abc_Nam_t *)0x0)) {
    iVar2 = 0;
    for (i = 0; i < (p->vObjs).nSize; i = i + 1) {
      pAVar1 = Au_NtkObjI(p,i);
      iVar2 = iVar2 + (uint)(((uint)*(ulong *)pAVar1 & 0x3fffffff) == Func &&
                            (~*(ulong *)pAVar1 & 0x700000000) == 0);
    }
  }
  return iVar2;
}

Assistant:

int Au_NtkNodeNumFunc( Au_Ntk_t * p, int Func )
{
    Au_Obj_t * pObj;
    int i, Counter = 0;
    if ( p->pMan && p->pMan->pFuncs )
        return 0;
    Au_NtkForEachNode( p, pObj, i )
    {
        Counter += (pObj->Func == (unsigned)Func);
//        printf( "%d ", pObj->Func );
    }
//    printf( "\n" );
    return Counter;
}